

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvactxinfo.c
# Opt level: O0

uint32_t ctxsize_strands(uint32_t reg_base)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t val;
  uint32_t uVar3;
  undefined4 local_1c;
  uint32_t host_io_port_off;
  uint32_t i;
  uint32_t io_idx;
  uint32_t strand_size;
  uint32_t strand_count;
  uint32_t reg_base_local;
  
  i = 0;
  iVar1 = 0x2ffc;
  if (0x100 < dev) {
    iVar1 = 0x20ac;
  }
  uVar2 = nva_rd32(cnum,reg_base + 0x2880);
  val = nva_rd32(cnum,reg_base + iVar1);
  for (local_1c = 0; local_1c < uVar2; local_1c = local_1c + 1) {
    nva_wr32(cnum,reg_base + iVar1,local_1c);
    uVar3 = nva_rd32(cnum,reg_base + 0x2910);
    i = uVar3 * 4 + i;
  }
  nva_wr32(cnum,reg_base + iVar1,val);
  return i;
}

Assistant:

uint32_t ctxsize_strands(uint32_t reg_base)
{
	uint32_t strand_count, strand_size = 0, io_idx, i;
	uint32_t host_io_port_off = dev > 0x100 ? 0x20ac : 0x2ffc;

	strand_count = nva_rd32(cnum, reg_base + 0x2880);
	io_idx = nva_rd32(cnum, reg_base + host_io_port_off);

	for (i = 0; i < strand_count; i++) {
		nva_wr32(cnum, reg_base + host_io_port_off, i);
		strand_size += (nva_rd32(cnum, reg_base + 0x2910) << 2);
	}
	nva_wr32(cnum, reg_base + host_io_port_off, io_idx);

	return strand_size;
}